

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmTargetSelectLinker::Consider(cmTargetSelectLinker *this,char *lang)

{
  cmGlobalGenerator *this_00;
  char *pcVar1;
  int iVar2;
  allocator local_79;
  value_type local_78;
  allocator local_41;
  string local_40;
  int local_1c;
  char *pcStack_18;
  int preference;
  char *lang_local;
  cmTargetSelectLinker *this_local;
  
  this_00 = this->GG;
  pcStack_18 = lang;
  lang_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,lang,&local_41);
  iVar2 = cmGlobalGenerator::GetLinkerPreference(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_1c = iVar2;
  if (this->Preference < iVar2) {
    this->Preference = iVar2;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Preferred);
  }
  pcVar1 = pcStack_18;
  if (local_1c == this->Preference) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,pcVar1,&local_79);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->Preferred,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return;
}

Assistant:

void Consider(const char* lang)
  {
    int preference = this->GG->GetLinkerPreference(lang);
    if (preference > this->Preference) {
      this->Preference = preference;
      this->Preferred.clear();
    }
    if (preference == this->Preference) {
      this->Preferred.insert(lang);
    }
  }